

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

ALLEGRO_FILE * al_create_file_handle(ALLEGRO_FILE_INTERFACE *drv,void *userdata)

{
  ALLEGRO_FILE *pAVar1;
  
  pAVar1 = (ALLEGRO_FILE *)
           al_malloc_with_context
                     (0x28,0x46,
                      "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file.c"
                      ,"al_create_file_handle");
  if (pAVar1 == (ALLEGRO_FILE *)0x0) {
    al_set_errno(0xc);
  }
  else {
    pAVar1->vtable = drv;
    pAVar1->userdata = userdata;
    pAVar1->ungetc_len = 0;
  }
  return pAVar1;
}

Assistant:

ALLEGRO_FILE *al_create_file_handle(const ALLEGRO_FILE_INTERFACE *drv,
   void *userdata)
{
   ALLEGRO_FILE *f;

   ASSERT(drv);

   f = al_malloc(sizeof(*f));
   if (!f) {
      al_set_errno(ENOMEM);
   }
   else {
      f->vtable = drv;
      f->userdata = userdata;
      f->ungetc_len = 0;
   }

   return f;
}